

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

DivideBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_dividebroadcastable
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x37a) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x37a;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.dividebroadcastable_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::DivideBroadcastableLayerParams>(arena);
    (this->layer_).dividebroadcastable_ = (DivideBroadcastableLayerParams *)LVar2;
  }
  return (DivideBroadcastableLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::DivideBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_dividebroadcastable() {
  if (!_internal_has_dividebroadcastable()) {
    clear_layer();
    set_has_dividebroadcastable();
    layer_.dividebroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::DivideBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.dividebroadcastable_;
}